

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

BOOL __thiscall
Js::InterpreterStackFrame::OP_BrOnHasEnvProperty
          (InterpreterStackFrame *this,Var envInstance,int32 slotIndex,uint propertyIdIndex,
          ScriptContext *scriptContext)

{
  PropertyId propertyId;
  BOOL BVar1;
  Var instance_00;
  Var instance;
  ScriptContext *scriptContext_local;
  uint propertyIdIndex_local;
  int32 slotIndex_local;
  Var envInstance_local;
  InterpreterStackFrame *this_local;
  
  instance_00 = OP_LdFrameDisplaySlot(this,envInstance,slotIndex);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),propertyIdIndex);
  BVar1 = Js::JavascriptOperators::OP_HasProperty(instance_00,propertyId,scriptContext);
  return BVar1;
}

Assistant:

BOOL InterpreterStackFrame::OP_BrOnHasEnvProperty(Var envInstance, int32 slotIndex, uint propertyIdIndex, ScriptContext* scriptContext)
    {
        Var instance = OP_LdFrameDisplaySlot(envInstance, slotIndex);
        return JavascriptOperators::OP_HasProperty(instance,
            this->m_functionBody->GetReferencedPropertyId(propertyIdIndex), scriptContext);
    }